

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O1

DdNode * selectMintermsFromUniverse(DdManager *manager,int *varSeen,double n)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  DdNode **vars;
  DdNode *pDVar6;
  DdNode *pDVar7;
  uint numVars;
  int iVar8;
  ulong uVar9;
  
  iVar2 = manager->size;
  if (iVar2 < 1) {
    numVars = 0;
  }
  else {
    numVars = 0;
    lVar4 = (ulong)(iVar2 - 1) + 1;
    do {
      numVars = numVars + (varSeen[lVar4 + -1] == 0);
      lVar5 = lVar4 + -1;
      bVar3 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar3);
  }
  pDVar7 = manager->one;
  vars = (DdNode **)malloc((long)(int)numVars << 3);
  if (vars == (DdNode **)0x0) {
    manager->errorCode = CUDD_MEMORY_OUT;
    pDVar7 = (DdNode *)0x0;
  }
  else {
    if (0 < iVar2) {
      iVar8 = 0;
      lVar4 = (ulong)(iVar2 - 1) + 1;
      do {
        if (varSeen[lVar4 + -1] == 0) {
          pDVar6 = cuddUniqueInter(manager,manager->perm[lVar4 + -1],pDVar7,
                                   (DdNode *)((ulong)pDVar7 ^ 1));
          vars[iVar8] = pDVar6;
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          iVar8 = iVar8 + 1;
        }
        lVar5 = lVar4 + -1;
        bVar3 = 0 < lVar4;
        lVar4 = lVar5;
      } while (lVar5 != 0 && bVar3);
    }
    pDVar7 = mintermsFromUniverse(manager,vars,numVars,n,0);
    if (pDVar7 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    if (0 < (int)numVars) {
      uVar9 = 0;
      do {
        Cudd_RecursiveDeref(manager,vars[uVar9]);
        uVar9 = uVar9 + 1;
      } while (numVars != uVar9);
    }
    free(vars);
  }
  return pDVar7;
}

Assistant:

static DdNode *
selectMintermsFromUniverse(
  DdManager * manager,
  int * varSeen,
  double  n)
{
    int numVars;
    int i, size, j;
     DdNode *one, *zero, *result;
    DdNode **vars;

    numVars = 0;
    size = manager->size;
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Count the number of variables not encountered so far in procedure
    ** cuddSplitSetRecur.
    */
    for (i = size-1; i >= 0; i--) {
        if(varSeen[i] == 0)
            numVars++;
    }
    vars = ABC_ALLOC(DdNode *, numVars);
    if (!vars) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    j = 0;
    for (i = size-1; i >= 0; i--) {
        if(varSeen[i] == 0) {
            vars[j] = cuddUniqueInter(manager,manager->perm[i],one,zero);
            cuddRef(vars[j]);
            j++;
        }
    }

    /* Compute a function which has n minterms and depends on at most
    ** numVars variables.
    */
    result = mintermsFromUniverse(manager,vars,numVars,n, 0);
    if (result) 
        cuddRef(result);

    for (i = 0; i < numVars; i++)
        Cudd_RecursiveDeref(manager,vars[i]);
    ABC_FREE(vars);

    return(result);

}